

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTypedConstraint.h
# Opt level: O2

btScalar btAdjustAngleToLimits
                   (btScalar angleInRadians,btScalar angleLowerLimitInRadians,
                   btScalar angleUpperLimitInRadians)

{
  btScalar bVar1;
  btScalar bVar2;
  
  if (angleLowerLimitInRadians < angleUpperLimitInRadians) {
    if (angleLowerLimitInRadians <= angleInRadians) {
      if (angleUpperLimitInRadians < angleInRadians) {
        bVar1 = btNormalizeAngle(angleInRadians - angleUpperLimitInRadians);
        bVar2 = btNormalizeAngle(angleInRadians - angleLowerLimitInRadians);
        angleInRadians =
             (btScalar)
             (~-(uint)(ABS(bVar2) < ABS(bVar1)) & (uint)angleInRadians |
             (uint)(angleInRadians + -6.2831855) & -(uint)(ABS(bVar2) < ABS(bVar1)));
      }
    }
    else {
      bVar1 = btNormalizeAngle(angleLowerLimitInRadians - angleInRadians);
      bVar2 = btNormalizeAngle(angleUpperLimitInRadians - angleInRadians);
      angleInRadians =
           (btScalar)
           (~-(uint)(ABS(bVar1) < ABS(bVar2)) & (uint)(angleInRadians + 6.2831855) |
           -(uint)(ABS(bVar1) < ABS(bVar2)) & (uint)angleInRadians);
    }
  }
  return angleInRadians;
}

Assistant:

SIMD_FORCE_INLINE btScalar btAdjustAngleToLimits(btScalar angleInRadians, btScalar angleLowerLimitInRadians, btScalar angleUpperLimitInRadians)
{
	if(angleLowerLimitInRadians >= angleUpperLimitInRadians)
	{
		return angleInRadians;
	}
	else if(angleInRadians < angleLowerLimitInRadians)
	{
		btScalar diffLo = btFabs(btNormalizeAngle(angleLowerLimitInRadians - angleInRadians));
		btScalar diffHi = btFabs(btNormalizeAngle(angleUpperLimitInRadians - angleInRadians));
		return (diffLo < diffHi) ? angleInRadians : (angleInRadians + SIMD_2_PI);
	}
	else if(angleInRadians > angleUpperLimitInRadians)
	{
		btScalar diffHi = btFabs(btNormalizeAngle(angleInRadians - angleUpperLimitInRadians));
		btScalar diffLo = btFabs(btNormalizeAngle(angleInRadians - angleLowerLimitInRadians));
		return (diffLo < diffHi) ? (angleInRadians - SIMD_2_PI) : angleInRadians;
	}
	else
	{
		return angleInRadians;
	}
}